

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::EnumValueDescriptorProto::InternalSerializeWithCachedSizesToArray
          (EnumValueDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  EnumValueOptions *this_00;
  void *pvVar1;
  bool bVar2;
  uint8 *puVar3;
  uint8 *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  if ((uVar5 & 4) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = this->number_;
    *target = '\x10';
    if ((ulong)(long)(int)uVar6 < 0x80) {
      target[1] = (byte)uVar6;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      uVar7 = (ulong)(long)(int)uVar6 >> 7;
      if (uVar6 < 0x4000) {
        target[2] = (uint8)uVar7;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar3 = target;
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          target = puVar3 + 1;
          bVar2 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar2);
        *puVar3 = (uint8)uVar8;
      }
    }
  }
  if ((uVar5 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->options_;
    *target = '\x1a';
    uVar5 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      puVar3 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)(uVar5 >> 7);
        puVar3 = target + 3;
      }
      else {
        puVar3 = target + 3;
        uVar5 = uVar5 >> 7;
        do {
          puVar4 = puVar3;
          puVar4[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          puVar3 = puVar4 + 1;
          bVar2 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar2);
        *puVar4 = (uint8)uVar6;
      }
    }
    target = EnumValueOptions::InternalSerializeWithCachedSizesToArray(this_00,puVar3,stream);
  }
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    return target;
  }
  puVar3 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe),target,stream);
  return puVar3;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* EnumValueDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumValueDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumValueDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional int32 number = 2;
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_number(), target);
  }

  // optional .google.protobuf.EnumValueOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        3, _Internal::options(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumValueDescriptorProto)
  return target;
}